

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

reference __thiscall
nlohmann::detail::
iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::operator*(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *this)

{
  value_t vVar1;
  invalid_iterator *piVar2;
  _Base_ptr p_Var3;
  allocator local_39;
  string local_38;
  
  p_Var3 = (_Base_ptr)this->m_object;
  vVar1 = (value_t)p_Var3->_M_color;
  if (vVar1 == object) {
    p_Var3 = (this->m_it).object_iterator._M_node + 2;
  }
  else if (vVar1 == array) {
    p_Var3 = (_Base_ptr)(this->m_it).array_iterator._M_current;
  }
  else {
    if (vVar1 == null) {
      piVar2 = (invalid_iterator *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_38,"cannot get value",&local_39);
      invalid_iterator::create(piVar2,0xd6,&local_38);
      __cxa_throw(piVar2,&invalid_iterator::typeinfo,exception::~exception);
    }
    if ((this->m_it).primitive_iterator.m_it != 0) {
      piVar2 = (invalid_iterator *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_38,"cannot get value",&local_39);
      invalid_iterator::create(piVar2,0xd6,&local_38);
      __cxa_throw(piVar2,&invalid_iterator::typeinfo,exception::~exception);
    }
  }
  return (reference)p_Var3;
}

Assistant:

reference operator*() const
    {
        JSON_ASSERT(m_object != nullptr);

        switch (m_object->m_type)
        {
            case value_t::object:
            {
                JSON_ASSERT(m_it.object_iterator != m_object->m_value.object->end());
                return m_it.object_iterator->second;
            }

            case value_t::array:
            {
                JSON_ASSERT(m_it.array_iterator != m_object->m_value.array->end());
                return *m_it.array_iterator;
            }

            case value_t::null:
                JSON_THROW(invalid_iterator::create(214, "cannot get value"));

            default:
            {
                if (JSON_HEDLEY_LIKELY(m_it.primitive_iterator.is_begin()))
                {
                    return *m_object;
                }

                JSON_THROW(invalid_iterator::create(214, "cannot get value"));
            }
        }
    }